

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseBreaks.cpp
# Opt level: O3

vector<Expr_*,_std::allocator<Expr_*>_> *
generatePhiAssignments
          (vector<Expr_*,_std::allocator<Expr_*>_> *__return_storage_ptr__,Block *blockEnding,
          Block *nextBlock)

{
  pointer *pppEVar1;
  Program *this;
  iterator __position;
  uint uVar2;
  Value *pVVar3;
  ulong uVar4;
  Value *pVVar5;
  long lVar6;
  PHINode *phi;
  Value *value;
  ulong uVar7;
  undefined1 auVar8 [16];
  Expr *incoming;
  Expr *phiVar;
  Expr *local_48;
  Expr *local_40;
  Expr *local_38;
  
  (__return_storage_ptr__->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = blockEnding->func->program;
  auVar8 = llvm::BasicBlock::phis();
  pVVar5 = auVar8._0_8_;
  value = pVVar5;
  do {
    if (value == auVar8._8_8_) {
      return (vector<Expr_*,_std::allocator<Expr_*>_> *)pVVar5;
    }
    local_38 = Program::getExpr(this,value);
    uVar2 = *(uint *)(value + 0x14);
    uVar4 = (ulong)(uVar2 & 0x7ffffff);
    if ((uVar2 & 0x7ffffff) != 0) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        if ((uVar2 >> 0x1e & 1) == 0) {
          if (*(BasicBlock **)
               (value + uVar7 * 8 + (ulong)*(uint *)(value + 0x3c) * 0x20 + uVar4 * -0x20) ==
              blockEnding->block) {
            pVVar5 = value + uVar4 * -0x20;
LAB_0015a32a:
            local_40 = Program::getExpr(this,*(Value **)(pVVar5 + lVar6));
            local_48 = Program::makeExpr<AssignExpr,Expr*&,Expr*&>(this,&local_38,&local_40);
            __position._M_current =
                 (__return_storage_ptr__->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Expr*,std::allocator<Expr*>>::_M_realloc_insert<Expr*>
                        ((vector<Expr*,std::allocator<Expr*>> *)__return_storage_ptr__,__position,
                         &local_48);
            }
            else {
              *__position._M_current = local_48;
              pppEVar1 = &(__return_storage_ptr__->
                          super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppEVar1 = *pppEVar1 + 1;
            }
            uVar2 = *(uint *)(value + 0x14);
          }
        }
        else {
          pVVar5 = *(Value **)(value + -8);
          if (*(BasicBlock **)(pVVar5 + uVar7 * 8 + (ulong)*(uint *)(value + 0x3c) * 0x20) ==
              blockEnding->block) goto LAB_0015a32a;
        }
        uVar7 = uVar7 + 1;
        uVar4 = (ulong)(uVar2 & 0x7ffffff);
        lVar6 = lVar6 + 0x20;
      } while (uVar7 < uVar4);
    }
    pVVar3 = *(Value **)(value + 0x20);
    value = pVVar3 + -0x18;
    if (pVVar3 != (Value *)0x0) {
      pVVar3 = value;
    }
    pVVar5 = (Value *)0x0;
    if (pVVar3[0x10] != (Value)0x52) {
      value = (Value *)0x0;
    }
  } while( true );
}

Assistant:

static std::vector<Expr*> generatePhiAssignments(Block* blockEnding, Block* nextBlock) {
    std::vector<Expr*> exprs;

    Program& program = *blockEnding->func->program;

    for (const auto& phi : nextBlock->block->phis()) {
        Expr* phiVar = program.getExpr(&phi);

        // see if nextBlock declares any incoming value from blockEnding
        for (unsigned i = 0; i < phi.getNumIncomingValues(); ++i) {
            if (phi.getIncomingBlock(i) == blockEnding->block) {
                Expr* incoming = program.getExpr(phi.getIncomingValue(i));
                exprs.push_back(program.makeExpr<AssignExpr>(phiVar, incoming));
            }
        }
    }

    return exprs;
}